

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O1

void ccfuncall(uint atom_index,int argnum,int bytenum)

{
  LispPTR *pLVar1;
  uint *puVar2;
  long lVar3;
  DLword *pDVar4;
  short sVar5;
  int iVar6;
  ulong uVar7;
  DLword *pDVar8;
  
  pDVar8 = MachineState.csp;
  if (((ulong)MachineState.csp & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",MachineState.csp);
  }
  MachineState.pvar[-5] =
       (short)((uint)((int)pDVar8 - (int)Lisp_world) >> 1) + (short)argnum * -2 + 4;
  MachineState.ivar = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
  MachineState.pvar[-6] =
       ((short)MachineState.currentpc + (short)bytenum) - (short)MachineState.currentfunc;
  pLVar1 = (LispPTR *)(MachineState.csp + 2);
  MachineState.csp = MachineState.csp + 2;
  *pLVar1 = MachineState.tosvalue;
  if ((atom_index & 0xfff0000) == 0) {
    pDVar8 = AtomSpace + (ulong)(atom_index * 5) * 2;
  }
  else {
    if ((atom_index & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)atom_index);
    }
    pDVar8 = (DLword *)((ulong)atom_index * 2 + CONCAT44(Lisp_world._4_4_,(int)Lisp_world));
  }
  uVar7 = (ulong)(*(uint *)(pDVar8 + 4) & 0xfffffff);
  if ((*(uint *)(pDVar8 + 4) & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar7);
  }
  lVar3 = CONCAT44(Lisp_world._4_4_,(int)Lisp_world);
  if (MachineState.endofstack <= MachineState.csp + (ulong)*(ushort *)(lVar3 + 2 + uVar7 * 2) + 0x20
     ) {
    iVar6 = do_stackoverflow(1);
    if (iVar6 != 0) {
      puVar2 = (uint *)(MachineState.csp + 2);
      MachineState.csp = MachineState.csp + 2;
      *puVar2 = argnum | 0xe0000;
      contextsw(2,(short)bytenum - 1,1);
      return;
    }
  }
  MachineState.currentfunc = (fnhead *)(uVar7 * 2 + lVar3);
  sVar5 = (MachineState.currentfunc)->na;
  if (-1 < sVar5) {
    iVar6 = argnum - sVar5;
    if (iVar6 < 0) {
      iVar6 = sVar5 - argnum;
      do {
        pDVar4 = MachineState.csp;
        MachineState.csp = MachineState.csp + 2;
        pDVar4[2] = 0;
        pDVar4[3] = 0;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      iVar6 = 0;
    }
    MachineState.csp = MachineState.csp + -(long)(iVar6 * 2);
  }
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0x8000;
  *(DLword *)((ulong)(MachineState.csp + 1) ^ 2) = MachineState.pvar[-5];
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xc000;
  pDVar4 = MachineState.pvar;
  if (((ulong)MachineState.pvar & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",MachineState.pvar);
  }
  *MachineState.csp = (DLword)((uint)((int)pDVar4 - (int)Lisp_world) >> 1);
  MachineState.pvar = MachineState.csp + 10;
  *(uint *)(MachineState.csp + 2) = *(uint *)(pDVar8 + 4) & 0xfffffff;
  MachineState.csp = MachineState.pvar;
  if ((ushort)(MachineState.currentfunc)->pv < 0x7fff) {
    sVar5 = (MachineState.currentfunc)->pv + 2;
    do {
      pDVar8 = MachineState.csp;
      pDVar8[0] = 0;
      pDVar8[1] = 0xffff;
      pDVar8 = MachineState.csp;
      MachineState.csp = MachineState.csp + 2;
      pDVar8[2] = 0;
      pDVar8[3] = 0xffff;
      MachineState.csp = MachineState.csp + 2;
      sVar5 = sVar5 + -1;
    } while (1 < sVar5);
  }
  MachineState.currentpc =
       (ByteCode *)
       ((long)MachineState.currentfunc + ((ulong)(MachineState.currentfunc)->startpc - 3));
  return;
}

Assistant:

void ccfuncall(unsigned int atom_index, int argnum, int bytenum)
 /* Atomindex for Function you want to invoke */
 /* Number of ARGS on TOS and STK */
 /* Number of bytes of Caller's OPCODE(including multi-byte) */
{
  struct definition_cell *defcell68k; /* Definition Cell PTR */
  short pv_num;                       /* scratch for pv */
  struct fnhead *tmp_fn;
  int rest; /* use for alignments */

  /* Get Next Block offset from argnum */
  CURRENTFX->nextblock = (LAddrFromNative(CurrentStackPTR) & 0x0ffff) - (argnum << 1) + 4 /* +3  */;

  /* Setup IVar */ /* XXX: is it really only 2-byte aligned? */
  IVar = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  /* Set PC to the Next Instruction and save into FX */
  CURRENTFX->pc = ((UNSIGNED)PC - (UNSIGNED)FuncObj) + bytenum;

  PushCStack; /* save TOS */

  /* Get DEFCELL 68k address */
  defcell68k = (struct definition_cell *)GetDEFCELL68k(atom_index);

  tmp_fn = (struct fnhead *)NativeAligned4FromLAddr(defcell68k->defpointer);

  if ((UNSIGNED)(CurrentStackPTR + tmp_fn->stkmin + STK_SAFE) >= (UNSIGNED)EndSTKP) {
    LispPTR test;
    test = *((LispPTR *)CurrentStackPTR);
    DOSTACKOVERFLOW(argnum, bytenum - 1);
    S_CHECK(test == *((LispPTR *)CurrentStackPTR), "stack overflow in ccfuncall");
  }
  FuncObj = tmp_fn;

  if (FuncObj->na >= 0) {
    /* This Function is Spread Type */
    /* Arguments on Stack Adjustment  */
    rest = argnum - FuncObj->na;

    while (rest < 0) {
      PushStack(NIL_PTR);
      rest++;
    }
    CurrentStackPTR -= (rest << 1);
  } /* if end */

  /* Set up BF */
  CurrentStackPTR += 2;
  GETWORD(CurrentStackPTR) = BF_MARK;
  GETWORD(CurrentStackPTR + 1) = CURRENTFX->nextblock;
  CurrentStackPTR += 2;

  /* Set up FX */
  GETWORD(CurrentStackPTR) = FX_MARK;

  /* Now SET new FX */
  ((struct frameex1 *)CurrentStackPTR)->alink = LAddrFromNative(PVar);
  PVar = (DLword *)CurrentStackPTR + FRAMESIZE;
#ifdef BIGVM
  ((struct frameex1 *)CurrentStackPTR)->fnheader = (defcell68k->defpointer);
#else
  ((struct frameex1 *)CurrentStackPTR)->lofnheader = (defcell68k->defpointer) & 0x0ffff;
  ((struct frameex1 *)CurrentStackPTR)->hi2fnheader = ((defcell68k->defpointer) & SEGMASK) >> 16;
#endif /* BIGVM */
  CurrentStackPTR = PVar;

  /* Set up PVar area */
  pv_num = FuncObj->pv + 1; /* Changed Apr.27 */

  while (pv_num > 0) {
    *((LispPTR *)CurrentStackPTR) = 0x0ffff0000;
    CurrentStackPTR += DLWORDSPER_CELL;
    *((LispPTR *)CurrentStackPTR) = 0x0ffff0000;
    CurrentStackPTR += DLWORDSPER_CELL;
    pv_num--;
  }

  /* Set PC points New Function's first OPCODE */
  PC = (ByteCode *)FuncObj + FuncObj->startpc;
  /* It assume that ccfuncall is called  for PUNTing from SUBRCALL */
  PC -= 3; /* Ajust PC */

}